

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

int uv__handle_fd(uv_handle_t *handle)

{
  uv_handle_type uVar1;
  long lVar2;
  
  uVar1 = handle->type;
  lVar2 = 0xb8;
  if ((uVar1 != UV_NAMED_PIPE) && (uVar1 != UV_TCP)) {
    if (uVar1 != UV_UDP) {
      return -1;
    }
    lVar2 = 0xb0;
  }
  return *(int *)((long)handle->handle_queue + lVar2 + -0x20);
}

Assistant:

static int uv__handle_fd(uv_handle_t* handle) {
  switch (handle->type) {
    case UV_NAMED_PIPE:
    case UV_TCP:
      return ((uv_stream_t*) handle)->io_watcher.fd;

    case UV_UDP:
      return ((uv_udp_t*) handle)->io_watcher.fd;

    default:
      return -1;
  }
}